

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::TypeReferenceExpression>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          TypeReferenceExpression *t)

{
  bool bVar1;
  TypeReferenceExpression *in_RSI;
  ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = Expression::bad(&in_RSI->super_Expression);
  if (!bVar1) {
    visitDefault<slang::ast::TypeReferenceExpression>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }